

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

OBSOLETE_DistanceDisplayMode
ON_DimStyle::DistanceDisplayModeFromLengthFormat(OBSOLETE_length_format lf)

{
  undefined1 local_a;
  OBSOLETE_DistanceDisplayMode ddm;
  OBSOLETE_length_format lf_local;
  
  if (lf == Decimal) {
    local_a = Decimal;
  }
  else if (lf == Fractional) {
    local_a = Fractional;
  }
  else if (lf == FeetInches) {
    local_a = FeetInches;
  }
  else {
    local_a = Decimal;
  }
  return local_a;
}

Assistant:

ON::OBSOLETE_DistanceDisplayMode ON_DimStyle::DistanceDisplayModeFromLengthFormat(
  ON_DimStyle::OBSOLETE_length_format lf
  )
{
  ON::OBSOLETE_DistanceDisplayMode ddm;
  switch (lf)
  {
  case ON_DimStyle::OBSOLETE_length_format::Decimal:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Decimal;
    break;
  case ON_DimStyle::OBSOLETE_length_format::Fractional:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Fractional;
    break;
  case ON_DimStyle::OBSOLETE_length_format::FeetInches:
    ddm = ON::OBSOLETE_DistanceDisplayMode::FeetInches;
    break;
  default:
    ddm = ON::OBSOLETE_DistanceDisplayMode::Decimal;
    break;
  }
  return ddm;
}